

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JobResults.cpp
# Opt level: O2

void xmrig::JobResults::stop(void)

{
  JobResultsPrivate *pJVar1;
  
  pJVar1 = xmrig::handler;
  if (xmrig::handler != (JobResultsPrivate *)0x0) {
    JobResultsPrivate::~JobResultsPrivate(xmrig::handler);
  }
  operator_delete(pJVar1);
  xmrig::handler = (JobResultsPrivate *)0x0;
  return;
}

Assistant:

void xmrig::JobResults::stop()
{
    assert(handler != nullptr);

    delete handler;

    handler = nullptr;
}